

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockHouseholder.h
# Opt level: O0

void Eigen::internal::
     apply_block_householder_on_the_left<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>,Eigen::VectorBlock<Eigen::Matrix<double,3,1,0,3,1>const,_1>>
               (Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false> *mat,
               Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *vectors,
               VectorBlock<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1> *hCoeffs,bool forward)

{
  Index *x;
  ConjugateReturnType hCoeffs_00;
  Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false> *local_1e0;
  Product<Eigen::TriangularView<const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_5U>,_Eigen::Matrix<double,__1,__1,_0,_3,_1>,_0>
  local_1d8;
  TriangularView<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_2U> local_198;
  MatrixTypeNested local_190;
  Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_1U>,_Eigen::Matrix<double,__1,__1,_0,_3,_1>,_0>
  local_188;
  MatrixTypeNested local_178;
  Product<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_2U>,_Eigen::Matrix<double,__1,__1,_0,_3,_1>,_0>
  local_170;
  AdjointReturnType local_160;
  Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>_>,_6U>,_Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
  local_128;
  Matrix<double,_1,_1,0,3,1> local_b8 [8];
  Matrix<double,__1,__1,_0,_3,_1> tmp;
  TriangularView<const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_5U> V;
  undefined1 local_48 [8];
  Matrix<double,__1,__1,_1,__1,__1> T;
  Index nbVecs;
  bool forward_local;
  VectorBlock<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1> *hCoeffs_local;
  Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *vectors_local;
  Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false> *mat_local;
  
  T.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
       MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>,_0>::cols
                 ((MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_0> *)
                  vectors);
  x = &T.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols;
  Matrix<double,-1,-1,1,-1,-1>::Matrix<long,long>((Matrix<double,_1,_1,1,_1,_1> *)local_48,x,x);
  if (forward) {
    make_block_householder_triangular_factor<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>,Eigen::VectorBlock<Eigen::Matrix<double,3,1,0,3,1>const,_1>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)local_48,vectors,hCoeffs);
  }
  else {
    hCoeffs_00 = DenseBase<Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1,_1,_false>_>
                 ::conjugate((DenseBase<Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_>
                              *)hCoeffs);
    make_block_householder_triangular_factor<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,_1,1,false>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)local_48,vectors,hCoeffs_00);
  }
  TriangularView<const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>,_5U>::
  TriangularView((TriangularView<const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_5U>
                  *)&tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_3,_1>_>.m_storage.
                     m_cols,vectors);
  TriangularView<const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>,_5U>::
  adjoint(&local_160,
          (TriangularView<const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_5U>
           *)&tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_3,_1>_>.m_storage.m_cols);
  TriangularViewImpl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>const>const,6u,Eigen::Dense>
  ::operator*(&local_128,
              (TriangularViewImpl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>const>const,6u,Eigen::Dense>
               *)&local_160,
              (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>_> *)mat)
  ;
  Matrix<double,-1,-1,0,3,1>::
  Matrix<Eigen::Product<Eigen::TriangularView<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>const>const,6u>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,_1,false>,0>>
            (local_b8,(EigenBase<Eigen::Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>_>,_6U>,_Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>_>
                       *)&local_128);
  if (forward) {
    local_178 = (MatrixTypeNested)
                MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::triangularView<2u>
                          ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)local_48);
    local_170 = TriangularViewImpl<Eigen::Matrix<double,-1,-1,1,-1,-1>,2u,Eigen::Dense>::operator*
                          ((TriangularViewImpl<Eigen::Matrix<double,_1,_1,1,_1,_1>,2u,Eigen::Dense>
                            *)&local_178,
                           (MatrixBase<Eigen::Matrix<double,__1,__1,_0,_3,_1>_> *)local_b8);
    Matrix<double,-1,-1,0,3,1>::operator=
              (local_b8,(DenseBase<Eigen::Product<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_2U>,_Eigen::Matrix<double,__1,__1,_0,_3,_1>,_0>_>
                         *)&local_170);
  }
  else {
    local_198.m_matrix =
         (MatrixTypeNested)
         MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::triangularView<2u>
                   ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)local_48);
    local_190.m_matrix =
         (non_const_type)
         TriangularView<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_2U>::adjoint(&local_198);
    local_188 = TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>const>const,1u,Eigen::Dense>
                ::operator*((TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,1u,Eigen::Dense>
                             *)&local_190,
                            (MatrixBase<Eigen::Matrix<double,__1,__1,_0,_3,_1>_> *)local_b8);
    Matrix<double,-1,-1,0,3,1>::operator=
              (local_b8,(DenseBase<Eigen::Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_1U>,_Eigen::Matrix<double,__1,__1,_0,_3,_1>,_0>_>
                         *)&local_188);
  }
  TriangularViewImpl<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>const,5u,Eigen::Dense>
  ::operator*(&local_1d8,
              (TriangularViewImpl<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>const,5u,Eigen::Dense>
               *)&tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_3,_1>_>.m_storage.
                  m_cols,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,_3,_1>_> *)local_b8);
  local_1e0 = (Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false> *)
              MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1,_-1,_false>_>::
              noalias((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>_>
                       *)mat);
  NoAlias<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,-1,-1,false>,Eigen::MatrixBase>::operator-=
            ((NoAlias<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,_1,false>,Eigen::MatrixBase> *
             )&local_1e0,
             (MatrixBase<Eigen::Product<Eigen::TriangularView<const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_5U>,_Eigen::Matrix<double,__1,__1,_0,_3,_1>,_0>_>
              *)&local_1d8);
  Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_1,__1,__1> *)local_48);
  return;
}

Assistant:

void apply_block_householder_on_the_left(MatrixType& mat, const VectorsType& vectors, const CoeffsType& hCoeffs, bool forward)
{
  enum { TFactorSize = MatrixType::ColsAtCompileTime };
  Index nbVecs = vectors.cols();
  Matrix<typename MatrixType::Scalar, TFactorSize, TFactorSize, RowMajor> T(nbVecs,nbVecs);
  
  if(forward) make_block_householder_triangular_factor(T, vectors, hCoeffs);
  else        make_block_householder_triangular_factor(T, vectors, hCoeffs.conjugate());  
  const TriangularView<const VectorsType, UnitLower> V(vectors);

  // A -= V T V^* A
  Matrix<typename MatrixType::Scalar,VectorsType::ColsAtCompileTime,MatrixType::ColsAtCompileTime,
         (VectorsType::MaxColsAtCompileTime==1 && MatrixType::MaxColsAtCompileTime!=1)?RowMajor:ColMajor,
         VectorsType::MaxColsAtCompileTime,MatrixType::MaxColsAtCompileTime> tmp = V.adjoint() * mat;
  // FIXME add .noalias() once the triangular product can work inplace
  if(forward) tmp = T.template triangularView<Upper>()           * tmp;
  else        tmp = T.template triangularView<Upper>().adjoint() * tmp;
  mat.noalias() -= V * tmp;
}